

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::BringWindowToDisplayFront(ImGuiWindow *window)

{
  ImGuiWindow **ppIVar1;
  ImGuiWindow **__src;
  int i;
  ImVector<ImGuiWindow_*> *this;
  int i_00;
  
  this = &GImGui->Windows;
  ppIVar1 = ImVector<ImGuiWindow_*>::back(this);
  if ((*ppIVar1 != window) && ((*ppIVar1)->RootWindowDockTree != window)) {
    i = this->Size + -1;
    do {
      i_00 = i;
      i = i_00 + -1;
      if (i < 0) {
        return;
      }
      ppIVar1 = ImVector<ImGuiWindow_*>::operator[](this,i);
    } while (*ppIVar1 != window);
    ppIVar1 = ImVector<ImGuiWindow_*>::operator[](this,i_00 + -1);
    __src = ImVector<ImGuiWindow_*>::operator[](this,i_00);
    memmove(ppIVar1,__src,(long)(this->Size - i_00) << 3);
    ppIVar1 = ImVector<ImGuiWindow_*>::operator[](this,this->Size + -1);
    *ppIVar1 = window;
  }
  return;
}

Assistant:

void ImGui::BringWindowToDisplayFront(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* current_front_window = g.Windows.back();
    if (current_front_window == window || current_front_window->RootWindowDockTree == window) // Cheap early out (could be better)
        return;
    for (int i = g.Windows.Size - 2; i >= 0; i--) // We can ignore the top-most window
        if (g.Windows[i] == window)
        {
            memmove(&g.Windows[i], &g.Windows[i + 1], (size_t)(g.Windows.Size - i - 1) * sizeof(ImGuiWindow*));
            g.Windows[g.Windows.Size - 1] = window;
            break;
        }
}